

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.cc
# Opt level: O3

t_operand __thiscall
xemmai::ast::t_if::f_emit(t_if *this,t_emit *a_emit,bool a_tail,bool a_operand,bool a_clear)

{
  t_block *a_junction;
  t_node *ptVar1;
  size_t sVar2;
  reference a_label;
  reference a_label_00;
  anon_union_8_4_0f1077ea_for_t_operand_2 extraout_RDX;
  anon_union_8_4_0f1077ea_for_t_operand_2 extraout_RDX_00;
  anon_union_8_4_0f1077ea_for_t_operand_2 aVar3;
  t_operand tVar4;
  vector<bool,_std::allocator<bool>_> local_60;
  void *local_38;
  
  ptVar1 = (this->v_condition)._M_t.
           super___uniq_ptr_impl<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>.
           _M_t.
           super__Tuple_impl<0UL,_xemmai::ast::t_node_*,_std::default_delete<xemmai::ast::t_node>_>.
           super__Head_base<0UL,_xemmai::ast::t_node_*,_false>._M_head_impl;
  (*ptVar1->_vptr_t_node[3])(ptVar1,a_emit,0,0,0);
  a_label = std::deque<xemmai::t_emit::t_label,_std::allocator<xemmai::t_emit::t_label>_>::
            emplace_back<>(a_emit->v_labels);
  a_emit->v_stack = a_emit->v_stack - 1;
  local_60.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._M_p = (_Bit_type *)t_code::v_labels[1];
  std::vector<void*,std::allocator<void*>>::emplace_back<void*>
            ((vector<void*,std::allocator<void*>> *)&a_emit->v_code->v_instructions,
             (void **)&local_60);
  local_60.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._M_p = (_Bit_type *)a_emit->v_stack;
  std::vector<void*,std::allocator<void*>>::emplace_back<void*>
            ((vector<void*,std::allocator<void*>> *)&a_emit->v_code->v_instructions,
             (void **)&local_60);
  t_emit::operator<<(a_emit,a_label);
  std::vector<bool,_std::allocator<bool>_>::vector(&local_60,a_emit->v_privates);
  sVar2 = a_emit->v_stack;
  anon_unknown_11::f_emit_block
            ((anon_unknown_11 *)a_emit,
             (t_emit *)
             (this->v_true).
             super__Vector_base<std::unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>,_std::allocator<std::unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start,
             (vector<std::unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>,_std::allocator<std::unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>_>_>
              *)(this->v_true).
                super__Vector_base<std::unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>,_std::allocator<std::unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish,a_tail,a_clear,this->v_preserve);
  a_junction = &this->v_junction;
  t_emit::f_join(a_emit,a_junction);
  a_label_00 = std::deque<xemmai::t_emit::t_label,_std::allocator<xemmai::t_emit::t_label>_>::
               emplace_back<>(a_emit->v_labels);
  local_38 = *t_code::v_labels;
  std::vector<void*,std::allocator<void*>>::emplace_back<void*>
            ((vector<void*,std::allocator<void*>> *)&a_emit->v_code->v_instructions,&local_38);
  t_emit::operator<<(a_emit,a_label_00);
  a_label->v_target =
       (long)(a_emit->v_code->v_instructions).super__Vector_base<void_*,_std::allocator<void_*>_>.
             _M_impl.super__Vector_impl_data._M_finish -
       (long)(a_emit->v_code->v_instructions).super__Vector_base<void_*,_std::allocator<void_*>_>.
             _M_impl.super__Vector_impl_data._M_start >> 3;
  std::vector<bool,_std::allocator<bool>_>::operator=(a_emit->v_privates,&local_60);
  a_emit->v_stack = sVar2;
  anon_unknown_11::f_emit_block
            ((anon_unknown_11 *)a_emit,
             (t_emit *)
             (this->v_false).
             super__Vector_base<std::unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>,_std::allocator<std::unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start,
             (vector<std::unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>,_std::allocator<std::unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>_>_>
              *)(this->v_false).
                super__Vector_base<std::unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>,_std::allocator<std::unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish,a_tail,a_clear,this->v_preserve);
  t_emit::f_join(a_emit,a_junction);
  a_label_00->v_target =
       (long)(a_emit->v_code->v_instructions).super__Vector_base<void_*,_std::allocator<void_*>_>.
             _M_impl.super__Vector_impl_data._M_finish -
       (long)(a_emit->v_code->v_instructions).super__Vector_base<void_*,_std::allocator<void_*>_>.
             _M_impl.super__Vector_impl_data._M_start >> 3;
  t_emit::f_merge(a_emit,a_junction);
  aVar3 = extraout_RDX;
  if (local_60.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
      super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
    operator_delete(local_60.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                    (long)local_60.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_end_of_storage -
                    (long)local_60.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
    aVar3 = extraout_RDX_00;
  }
  tVar4.field_1.v_integer = aVar3.v_integer;
  tVar4._0_8_ = 4;
  return tVar4;
}

Assistant:

t_operand t_if::f_emit(t_emit& a_emit, bool a_tail, bool a_operand, bool a_clear)
{
	v_condition->f_emit(a_emit, false, false);
	auto& label0 = a_emit.f_label();
	a_emit.f_pop();
	a_emit << c_instruction__BRANCH << a_emit.v_stack << label0;
	auto privates = *a_emit.v_privates;
	auto stack = a_emit.v_stack;
	f_emit_block(a_emit, v_true, a_tail, a_clear, v_preserve);
	a_emit.f_join(v_junction);
	auto& label1 = a_emit.f_label();
	a_emit << c_instruction__JUMP << label1;
	a_emit.f_target(label0);
	*a_emit.v_privates = privates;
	a_emit.v_stack = stack;
	f_emit_block(a_emit, v_false, a_tail, a_clear, v_preserve);
	a_emit.f_join(v_junction);
	a_emit.f_target(label1);
	a_emit.f_merge(v_junction);
	return {};
}